

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O1

void __thiscall
Func::SetConstructorCache
          (Func *this,ProfileId profiledCallSiteId,JITTimeConstructorCache *constructorCache)

{
  code *pcVar1;
  bool bVar2;
  ProfileId PVar3;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar4;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  PVar3 = JITTimeFunctionBody::GetProfiledCallSiteCount(this_00);
  if (PVar3 <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x6b0,
                       "(profiledCallSiteId < GetJITFunctionBody()->GetProfiledCallSiteCount())",
                       "profiledCallSiteId < GetJITFunctionBody()->GetProfiledCallSiteCount()");
    if (!bVar2) goto LAB_00430064;
    *puVar4 = 0;
  }
  if (constructorCache == (JITTimeConstructorCache *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x6b1,"(constructorCache != nullptr)","constructorCache != nullptr");
    if (!bVar2) goto LAB_00430064;
    *puVar4 = 0;
  }
  if (this->constructorCaches == (JITTimeConstructorCache **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x6b2,"(this->constructorCaches != nullptr)",
                       "this->constructorCaches != nullptr");
    if (!bVar2) goto LAB_00430064;
    *puVar4 = 0;
  }
  if (this->constructorCaches[profiledCallSiteId] != (JITTimeConstructorCache *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x6b3,"(this->constructorCaches[profiledCallSiteId] == nullptr)",
                       "this->constructorCaches[profiledCallSiteId] == nullptr");
    if (!bVar2) {
LAB_00430064:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this->constructorCacheCount = this->constructorCacheCount + 1;
  this->constructorCaches[profiledCallSiteId] = constructorCache;
  return;
}

Assistant:

void Func::SetConstructorCache(const Js::ProfileId profiledCallSiteId, JITTimeConstructorCache* constructorCache)
{
    AssertOrFailFast(profiledCallSiteId < GetJITFunctionBody()->GetProfiledCallSiteCount());
    Assert(constructorCache != nullptr);
    Assert(this->constructorCaches != nullptr);
    Assert(this->constructorCaches[profiledCallSiteId] == nullptr);
    this->constructorCacheCount++;
    this->constructorCaches[profiledCallSiteId] = constructorCache;
}